

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::CopyingFileInputStream
          (CopyingFileInputStream *this,int file_descriptor)

{
  uint local_18;
  int flags;
  int file_descriptor_local;
  CopyingFileInputStream *this_local;
  
  CopyingInputStream::CopyingInputStream(&this->super_CopyingInputStream);
  (this->super_CopyingInputStream)._vptr_CopyingInputStream =
       (_func_int **)&PTR__CopyingFileInputStream_008e9a70;
  this->file_ = file_descriptor;
  this->close_on_delete_ = false;
  this->is_closed_ = false;
  this->errno_ = 0;
  this->previous_seek_failed_ = false;
  local_18 = fcntl(this->file_,3);
  local_18 = local_18 & 0xfffff7ff;
  fcntl(this->file_,4,(ulong)local_18);
  return;
}

Assistant:

FileInputStream::CopyingFileInputStream::CopyingFileInputStream(
    int file_descriptor)
    : file_(file_descriptor),
      close_on_delete_(false),
      is_closed_(false),
      errno_(0),
      previous_seek_failed_(false) {
#ifndef _WIN32
  int flags = fcntl(file_, F_GETFL);
  flags &= ~O_NONBLOCK;
  fcntl(file_, F_SETFL, flags);
#endif
}